

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb2Flow.c
# Opt level: O0

int Llb_ManCutVolume(Aig_Man_t *p,Vec_Ptr_t *vLower,Vec_Ptr_t *vUpper)

{
  int iVar1;
  Aig_Obj_t *pAVar2;
  undefined4 local_30;
  undefined4 local_2c;
  int Counter;
  int i;
  Aig_Obj_t *pObj;
  Vec_Ptr_t *vUpper_local;
  Vec_Ptr_t *vLower_local;
  Aig_Man_t *p_local;
  
  local_30 = 0;
  Aig_ManIncrementTravId(p);
  for (local_2c = 0; iVar1 = Vec_PtrSize(vLower), local_2c < iVar1; local_2c = local_2c + 1) {
    pAVar2 = (Aig_Obj_t *)Vec_PtrEntry(vLower,local_2c);
    Aig_ObjSetTravIdCurrent(p,pAVar2);
  }
  for (local_2c = 0; iVar1 = Vec_PtrSize(vUpper), local_2c < iVar1; local_2c = local_2c + 1) {
    pAVar2 = (Aig_Obj_t *)Vec_PtrEntry(vUpper,local_2c);
    iVar1 = Llb_ManCutVolume_rec(p,pAVar2);
    local_30 = iVar1 + local_30;
  }
  return local_30;
}

Assistant:

int Llb_ManCutVolume( Aig_Man_t * p, Vec_Ptr_t * vLower, Vec_Ptr_t * vUpper )
{
    Aig_Obj_t * pObj;
    int i, Counter = 0;
    // mark the lower cut with the traversal ID
    Aig_ManIncrementTravId(p);
    Vec_PtrForEachEntry( Aig_Obj_t *, vLower, pObj, i )
        Aig_ObjSetTravIdCurrent( p, pObj );
    // count the upper cut
    Vec_PtrForEachEntry( Aig_Obj_t *, vUpper, pObj, i )
        Counter += Llb_ManCutVolume_rec( p, pObj );
    return Counter;
}